

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall tetgenio::load_var(tetgenio *this,char *filebasename)

{
  char *result;
  size_t sVar1;
  FILE *__stream;
  tetgenio *ptVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  byte bVar6;
  char *in_RCX;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  double dVar10;
  char *stringptr;
  char varfilename [1024];
  char inputline [2048];
  tetgenio *local_c40;
  char local_c38 [4];
  undefined1 auStack_c34 [1020];
  char local_838 [2056];
  
  strcpy(local_c38,filebasename);
  sVar1 = strlen(local_c38);
  builtin_strncpy(local_c38 + sVar1,".var",4);
  auStack_c34[sVar1] = 0;
  __stream = fopen(local_c38,"r");
  if (__stream == (FILE *)0x0) {
    return false;
  }
  pcVar9 = "Opening %s.\n";
  iVar8 = 0;
  printf("Opening %s.\n",local_c38);
  ptVar2 = (tetgenio *)readnumberline((tetgenio *)pcVar9,local_838,(FILE *)__stream,in_RCX);
  bVar7 = true;
  local_c40 = ptVar2;
  if (ptVar2 == (tetgenio *)0x0) goto LAB_0010f355;
  if ((char)ptVar2->firstnumber != '\0') {
    lVar3 = strtol((char *)ptVar2,(char **)&local_c40,0);
    iVar8 = (int)lVar3;
    pcVar9 = (char *)ptVar2;
  }
  this->numberoffacetconstraints = iVar8;
  if (iVar8 < 1) {
LAB_0010f150:
    bVar7 = true;
    local_c40 = (tetgenio *)readnumberline((tetgenio *)pcVar9,local_838,(FILE *)__stream,in_RCX);
    if (local_c40 == (tetgenio *)0x0) goto LAB_0010f355;
    if ((char)local_c40->firstnumber == '\0') {
      iVar8 = 0;
    }
    else {
      lVar3 = strtol((char *)local_c40,(char **)&local_c40,0);
      iVar8 = (int)lVar3;
    }
    this->numberofsegmentconstraints = iVar8;
    if (iVar8 < 1) goto LAB_0010f355;
    ptVar2 = (tetgenio *)((ulong)(uint)(iVar8 * 3) << 3);
    pdVar4 = (double *)operator_new__((ulong)ptVar2);
    this->segmentconstraintlist = pdVar4;
    if (this->numberofsegmentconstraints < 1) {
      iVar8 = 0;
    }
    else {
      lVar3 = 0;
      iVar8 = 0;
      do {
        local_c40 = (tetgenio *)readnumberline(ptVar2,local_838,(FILE *)__stream,in_RCX);
        while ((uVar5 = (ulong)(byte)local_c40->firstnumber, 0x2c < uVar5 ||
               ((0x100900000201U >> (uVar5 & 0x3f) & 1) == 0))) {
          local_c40 = (tetgenio *)((long)&local_c40->firstnumber + 1);
        }
LAB_0010f1fc:
        bVar6 = (byte)local_c40->firstnumber;
        in_RCX = (char *)(ulong)bVar6;
        if ((char *)0x2e < in_RCX) {
LAB_0010f211:
          bVar6 = bVar6 - 0x3a;
          in_RCX = (char *)(ulong)bVar6;
          if (0xf5 < bVar6) goto LAB_0010f21e;
          local_c40 = (tetgenio *)((long)&local_c40->firstnumber + 1);
          goto LAB_0010f1fc;
        }
        if ((0x680000000001U >> ((ulong)in_RCX & 0x3f) & 1) != 0) goto LAB_0010f21e;
        if (in_RCX != (char *)0x23) goto LAB_0010f211;
        *(char *)&local_c40->firstnumber = '\0';
LAB_0010f21e:
        if ((char)local_c40->firstnumber == '\0') {
          pcVar9 = "Error:  segment constraint %d has no frist endpoint.\n";
LAB_0010f33a:
          printf(pcVar9,(ulong)(uint)(this->firstnumber + iVar8));
          break;
        }
        dVar10 = strtod((char *)local_c40,(char **)&local_c40);
        this->segmentconstraintlist[lVar3] = dVar10;
        while ((uVar5 = (ulong)(byte)local_c40->firstnumber, 0x2c < uVar5 ||
               ((0x100900000201U >> (uVar5 & 0x3f) & 1) == 0))) {
          local_c40 = (tetgenio *)((long)&local_c40->firstnumber + 1);
        }
LAB_0010f262:
        bVar6 = (byte)local_c40->firstnumber;
        uVar5 = (ulong)bVar6;
        if (0x2e < uVar5) {
LAB_0010f277:
          if (0xf5 < (byte)(bVar6 - 0x3a)) goto LAB_0010f282;
          local_c40 = (tetgenio *)((long)&local_c40->firstnumber + 1);
          goto LAB_0010f262;
        }
        if ((0x680000000001U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0010f282;
        if (uVar5 != 0x23) goto LAB_0010f277;
        *(undefined1 *)&local_c40->firstnumber = 0;
LAB_0010f282:
        if ((char)local_c40->firstnumber == '\0') {
          pcVar9 = "Error:  segment constraint %d has no second endpoint.\n";
          goto LAB_0010f33a;
        }
        dVar10 = strtod((char *)local_c40,(char **)&local_c40);
        this->segmentconstraintlist[lVar3 + 1] = dVar10;
        ptVar2 = local_c40;
        while ((uVar5 = (ulong)(byte)ptVar2->firstnumber, 0x2c < uVar5 ||
               ((0x100900000201U >> (uVar5 & 0x3f) & 1) == 0))) {
          ptVar2 = (tetgenio *)((long)&ptVar2->firstnumber + 1);
        }
LAB_0010f2c4:
        bVar6 = (byte)ptVar2->firstnumber;
        uVar5 = (ulong)bVar6;
        if (0x2e < uVar5) {
LAB_0010f2d9:
          if (0xf5 < (byte)(bVar6 - 0x3a)) goto LAB_0010f2e4;
          ptVar2 = (tetgenio *)((long)&ptVar2->firstnumber + 1);
          goto LAB_0010f2c4;
        }
        if ((0x680000000001U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0010f2e4;
        if (uVar5 != 0x23) goto LAB_0010f2d9;
        *(undefined1 *)&ptVar2->firstnumber = 0;
LAB_0010f2e4:
        local_c40 = ptVar2;
        if ((char)ptVar2->firstnumber == '\0') {
          pcVar9 = "Error:  segment constraint %d has no maximum length bound.\n";
          goto LAB_0010f33a;
        }
        dVar10 = strtod((char *)ptVar2,(char **)&local_c40);
        this->segmentconstraintlist[lVar3 + 2] = dVar10;
        lVar3 = lVar3 + 3;
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->numberofsegmentconstraints);
    }
    bVar7 = true;
    if (this->numberofsegmentconstraints <= iVar8) goto LAB_0010f355;
  }
  else {
    pcVar9 = (char *)((ulong)(uint)(iVar8 * 2) << 3);
    pdVar4 = (double *)operator_new__((ulong)pcVar9);
    this->facetconstraintlist = pdVar4;
    if (this->numberoffacetconstraints < 1) {
      iVar8 = 0;
    }
    else {
      lVar3 = 0;
      iVar8 = 0;
      do {
        local_c40 = (tetgenio *)readnumberline((tetgenio *)pcVar9,local_838,(FILE *)__stream,in_RCX)
        ;
        while ((uVar5 = (ulong)(byte)local_c40->firstnumber, 0x2c < uVar5 ||
               ((0x100900000201U >> (uVar5 & 0x3f) & 1) == 0))) {
          local_c40 = (tetgenio *)((long)&local_c40->firstnumber + 1);
        }
LAB_0010f059:
        bVar6 = (byte)local_c40->firstnumber;
        in_RCX = (char *)(ulong)bVar6;
        if ((char *)0x2e < in_RCX) {
LAB_0010f06e:
          bVar6 = bVar6 - 0x3a;
          in_RCX = (char *)(ulong)bVar6;
          if (0xf5 < bVar6) goto LAB_0010f07b;
          local_c40 = (tetgenio *)((long)&local_c40->firstnumber + 1);
          goto LAB_0010f059;
        }
        if ((0x680000000001U >> ((ulong)in_RCX & 0x3f) & 1) != 0) goto LAB_0010f07b;
        if (in_RCX != (char *)0x23) goto LAB_0010f06e;
        *(char *)&local_c40->firstnumber = '\0';
LAB_0010f07b:
        if ((char)local_c40->firstnumber == '\0') {
          ptVar2 = (tetgenio *)"Error:  facet constraint %d has no facet marker.\n";
LAB_0010f131:
          pcVar9 = (char *)ptVar2;
          printf(pcVar9,(ulong)(uint)(this->firstnumber + iVar8));
          break;
        }
        dVar10 = strtod((char *)local_c40,(char **)&local_c40);
        this->facetconstraintlist[lVar3] = dVar10;
        pcVar9 = (char *)local_c40;
        while ((uVar5 = (ulong)(byte)((tetgenio *)pcVar9)->firstnumber, 0x2c < uVar5 ||
               ((0x100900000201U >> (uVar5 & 0x3f) & 1) == 0))) {
          pcVar9 = (char *)((long)&((tetgenio *)pcVar9)->firstnumber + 1);
        }
LAB_0010f0bf:
        bVar6 = (byte)((tetgenio *)pcVar9)->firstnumber;
        uVar5 = (ulong)bVar6;
        if (0x2e < uVar5) {
LAB_0010f0d4:
          if (0xf5 < (byte)(bVar6 - 0x3a)) goto LAB_0010f0df;
          pcVar9 = (char *)((long)&((tetgenio *)pcVar9)->firstnumber + 1);
          goto LAB_0010f0bf;
        }
        if ((0x680000000001U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_0010f0df;
        if (uVar5 != 0x23) goto LAB_0010f0d4;
        *(undefined1 *)&((tetgenio *)pcVar9)->firstnumber = 0;
LAB_0010f0df:
        local_c40 = (tetgenio *)pcVar9;
        if ((char)((tetgenio *)pcVar9)->firstnumber == '\0') {
          ptVar2 = (tetgenio *)"Error:  facet constraint %d has no maximum area bound.\n";
          goto LAB_0010f131;
        }
        dVar10 = strtod(pcVar9,(char **)&local_c40);
        this->facetconstraintlist[lVar3 + 1] = dVar10;
        lVar3 = lVar3 + 2;
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->numberoffacetconstraints);
    }
    if (this->numberoffacetconstraints <= iVar8) goto LAB_0010f150;
  }
  bVar7 = false;
LAB_0010f355:
  fclose(__stream);
  return bVar7;
}

Assistant:

bool tetgenio::load_var(char* filebasename)
{
  FILE *infile;
  char varfilename[FILENAMESIZE];
  char inputline[INPUTLINESIZE];
  char *stringptr;
  int index;
  int i;

  // Variant constraints are saved in file "filename.var".
  strcpy(varfilename, filebasename);
  strcat(varfilename, ".var");
  infile = fopen(varfilename, "r");
  if (infile != (FILE *) NULL) {
    printf("Opening %s.\n", varfilename);
  } else {
    return false;
  }

  // Read the facet constraint section.
  stringptr = readnumberline(inputline, infile, varfilename);
  if (stringptr == NULL) {
    // No region list, return.
    fclose(infile);
    return true;
  }
  if (*stringptr != '\0') {
    numberoffacetconstraints = (int) strtol (stringptr, &stringptr, 0);
  } else {
    numberoffacetconstraints = 0;
  }
  if (numberoffacetconstraints > 0) {
    // Initialize 'facetconstraintlist'.
    facetconstraintlist = new REAL[numberoffacetconstraints * 2];
    index = 0;
    for (i = 0; i < numberoffacetconstraints; i++) {
      stringptr = readnumberline(inputline, infile, varfilename);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  facet constraint %d has no facet marker.\n",
               firstnumber + i);
        break;
      } else {
        facetconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  facet constraint %d has no maximum area bound.\n",
               firstnumber + i);
        break;
      } else {
        facetconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
    }
    if (i < numberoffacetconstraints) {
      // This must be caused by an error.
      fclose(infile);
      return false;
    }
  }

  // Read the segment constraint section.
  stringptr = readnumberline(inputline, infile, varfilename);
  if (stringptr == NULL) {
    // No segment list, return.
    fclose(infile);
    return true;
  }
  if (*stringptr != '\0') {
    numberofsegmentconstraints = (int) strtol (stringptr, &stringptr, 0);
  } else {
    numberofsegmentconstraints = 0;
  }
  if (numberofsegmentconstraints > 0) {
    // Initialize 'segmentconstraintlist'.
    segmentconstraintlist = new REAL[numberofsegmentconstraints * 3];
    index = 0;
    for (i = 0; i < numberofsegmentconstraints; i++) {
      stringptr = readnumberline(inputline, infile, varfilename);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no frist endpoint.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no second endpoint.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  segment constraint %d has no maximum length bound.\n",
               firstnumber + i);
        break;
      } else {
        segmentconstraintlist[index++] = (REAL) strtod(stringptr, &stringptr);
      }
    }
    if (i < numberofsegmentconstraints) {
      // This must be caused by an error.
      fclose(infile);
      return false;
    }
  }

  fclose(infile);
  return true;
}